

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

void __thiscall
P2Pt::pose_poly<double>::get_r_t_from_rhos
          (pose_poly<double> *this,uint ts_len,double (*sigmas1) [8],uint *sigmas1_len,
          double (*sigmas2) [8],double *rhos1,double *rhos2,double *gama1,double *tgt1,double *gama2
          ,double *tgt2,double *Gama1,double *Tgt1,double *Gama2,double *Tgt2,
          double (*output) [64] [4] [3],uint *output_len)

{
  uint uVar1;
  double (*output_m) [4] [3];
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  long in_R8;
  long in_R9;
  double B [3] [3];
  double (*Transls) [3];
  double (*Rots) [4] [3];
  uint j_1;
  uint i_1;
  uint *RT_len;
  double (*RT) [64] [4] [3];
  double inv_A [3] [3];
  double A [3] [3];
  uint j;
  double dgamas_rhos [3];
  uint i;
  double DGama [3];
  double lambdas2 [8] [8];
  double lambdas1 [8] [8];
  double local_588;
  double local_580;
  double (*in_stack_fffffffffffffa88) [3] [3];
  double (*in_stack_fffffffffffffa90) [3] [3];
  uint local_530;
  uint local_52c;
  double local_518 [10];
  double local_4c8;
  undefined8 local_4c0;
  double local_4b8;
  double local_4b0;
  undefined8 local_4a8;
  double local_4a0;
  double local_498;
  undefined8 local_490;
  double local_488;
  uint local_47c;
  double local_478;
  double local_470;
  double local_468;
  uint local_45c;
  double local_458;
  double local_450;
  double local_448;
  double local_438 [64];
  double local_238 [65];
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  uint local_c;
  
  local_4c8 = *(double *)B[2][0] - *(double *)B[2][2];
  local_4b0 = *(double *)((long)B[2][0] + 8) - *(double *)((long)B[2][2] + 8);
  local_498 = *(double *)((long)B[2][0] + 0x10) - *(double *)((long)B[2][2] + 0x10);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  for (local_45c = 0; local_45c < local_c; local_45c = local_45c + 1) {
    local_478 = *(double *)(local_30 + (ulong)local_45c * 8) * *(double *)B[0][2] -
                *(double *)((long)B[0][1] + (ulong)local_45c * 8) * *(double *)B[1][1];
    local_470 = *(double *)(local_30 + (ulong)local_45c * 8) * *(double *)((long)B[0][2] + 8) -
                *(double *)((long)B[0][1] + (ulong)local_45c * 8) * *(double *)((long)B[1][1] + 8);
    local_468 = *(double *)(local_30 + (ulong)local_45c * 8) * *(double *)((long)B[0][2] + 0x10) -
                *(double *)((long)B[0][1] + (ulong)local_45c * 8) *
                *(double *)((long)B[1][1] + 0x10);
    local_47c = 0;
    while( true ) {
      if (*(uint *)(local_20 + (ulong)local_45c * 4) <= local_47c) break;
      local_238[(ulong)local_45c * 8 + (ulong)local_47c] =
           (local_4c8 * *(double *)B[2][1] + local_4b0 * *(double *)((long)B[2][1] + 8) +
           local_498 * *(double *)((long)B[2][1] + 0x10)) /
           (local_478 *
            (*(double *)(local_30 + (ulong)local_45c * 8) * *(double *)B[1][0] +
            *(double *)(local_18 + (ulong)local_45c * 0x40 + (ulong)local_47c * 8) *
            *(double *)B[0][2]) +
            local_470 *
            (*(double *)(local_30 + (ulong)local_45c * 8) * *(double *)((long)B[1][0] + 8) +
            *(double *)(local_18 + (ulong)local_45c * 0x40 + (ulong)local_47c * 8) *
            *(double *)((long)B[0][2] + 8)) +
           local_468 *
           (*(double *)(local_30 + (ulong)local_45c * 8) * *(double *)((long)B[1][0] + 0x10) +
           *(double *)(local_18 + (ulong)local_45c * 0x40 + (ulong)local_47c * 8) *
           *(double *)((long)B[0][2] + 0x10)));
      local_438[(ulong)local_45c * 8 + (ulong)local_47c] =
           (local_4c8 * (*Transls)[0] + local_4b0 * (*Transls)[1] + local_498 * (*Transls)[2]) /
           (local_478 *
            (*(double *)((long)B[0][1] + (ulong)local_45c * 8) * *(double *)B[1][2] +
            *(double *)(local_28 + (ulong)local_45c * 0x40 + (ulong)local_47c * 8) *
            *(double *)B[1][1]) +
            local_470 *
            (*(double *)((long)B[0][1] + (ulong)local_45c * 8) * *(double *)((long)B[1][2] + 8) +
            *(double *)(local_28 + (ulong)local_45c * 0x40 + (ulong)local_47c * 8) *
            *(double *)((long)B[1][1] + 8)) +
           local_468 *
           (*(double *)((long)B[0][1] + (ulong)local_45c * 8) * *(double *)((long)B[1][2] + 0x10) +
           *(double *)(local_28 + (ulong)local_45c * 0x40 + (ulong)local_47c * 8) *
           *(double *)((long)B[1][1] + 0x10)));
      local_47c = local_47c + 1;
    }
  }
  local_4c0 = *(undefined8 *)B[2][1];
  local_4b8 = (*Transls)[0];
  local_4a8 = *(undefined8 *)((long)B[2][1] + 8);
  local_4a0 = (*Transls)[1];
  local_490 = *(undefined8 *)((long)B[2][1] + 0x10);
  local_488 = (*Transls)[2];
  local_458 = local_4c8;
  local_450 = local_4b0;
  local_448 = local_498;
  invm3x3<double>(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  *_j_1 = 0;
  for (local_52c = 0; local_52c < local_c; local_52c = local_52c + 1) {
    local_530 = 0;
    while (local_530 < *(uint *)(local_20 + (ulong)local_52c * 4)) {
      output_m = Rots + *_j_1;
      uVar1 = *_j_1;
      local_588 = *(double *)(local_30 + (ulong)local_52c * 8) * *(double *)B[0][2] -
                  *(double *)((long)B[0][1] + (ulong)local_52c * 8) * *(double *)B[1][1];
      local_580 = local_238[(ulong)local_52c * 8 + (ulong)local_530] *
                  (*(double *)(local_30 + (ulong)local_52c * 8) * *(double *)B[1][0] +
                  *(double *)(local_18 + (ulong)local_52c * 0x40 + (ulong)local_530 * 8) *
                  *(double *)B[0][2]);
      multm3x3<double>((double (*) [3] [3])&local_588,(double (*) [3] [3])local_518,*output_m);
      Rots[uVar1][3][0] =
           ((*(double *)(local_30 + (ulong)local_52c * 8) * *(double *)B[0][2] -
            (*output_m)[0][0] * *(double *)B[2][0]) -
           (*output_m)[0][1] * *(double *)((long)B[2][0] + 8)) -
           (*output_m)[0][2] * *(double *)((long)B[2][0] + 0x10);
      Rots[uVar1][3][1] =
           ((*(double *)(local_30 + (ulong)local_52c * 8) * *(double *)((long)B[0][2] + 8) -
            (*output_m)[1][0] * *(double *)B[2][0]) -
           (*output_m)[1][1] * *(double *)((long)B[2][0] + 8)) -
           (*output_m)[1][2] * *(double *)((long)B[2][0] + 0x10);
      Rots[uVar1][3][2] =
           ((*(double *)(local_30 + (ulong)local_52c * 8) * *(double *)((long)B[0][2] + 0x10) -
            (*output_m)[2][0] * *(double *)B[2][0]) -
           (*output_m)[2][1] * *(double *)((long)B[2][0] + 8)) -
           (*output_m)[2][2] * *(double *)((long)B[2][0] + 0x10);
      local_530 = local_530 + 1;
      *_j_1 = *_j_1 + 1;
    }
  }
  return;
}

Assistant:

void pose_poly<T>::
get_r_t_from_rhos(
	const unsigned ts_len,
	const T sigmas1[TS_MAX_LEN][TS_MAX_LEN], const unsigned sigmas1_len[TS_MAX_LEN],
	const T sigmas2[TS_MAX_LEN][TS_MAX_LEN],
	const T rhos1[ROOT_IDS_LEN], const T rhos2[ROOT_IDS_LEN],
	const T gama1[3], const T tgt1[3],
	const T gama2[3], const T tgt2[3],
	const T Gama1[3], const T Tgt1[3],
	const T Gama2[3], const T Tgt2[3],
	T (*output)[RT_MAX_LEN][4][3], unsigned *output_len
)
{
	T lambdas1[TS_MAX_LEN][TS_MAX_LEN]; T lambdas2[TS_MAX_LEN][TS_MAX_LEN];
	const T DGama[3] = {Gama1[0]-Gama2[0], Gama1[1]-Gama2[1], Gama1[2]-Gama2[2]};
  
	for (unsigned i = 0; i < ts_len; i++) {
    const T dgamas_rhos[3] = {
     rhos1[i]*gama1[0] - rhos2[i]*gama2[0],
     rhos1[i]*gama1[1] - rhos2[i]*gama2[1],
     rhos1[i]*gama1[2] - rhos2[i]*gama2[2]};
		for (unsigned j = 0; j < sigmas1_len[i]; j++) {
			lambdas1[i][j] = 
        (DGama[0]*Tgt1[0]+DGama[1]*Tgt1[1] + DGama[2]*Tgt1[2]) / 
        (dgamas_rhos[0]*(rhos1[i]*tgt1[0] + sigmas1[i][j]*gama1[0]) + 
        dgamas_rhos[1]*(rhos1[i]*tgt1[1] + sigmas1[i][j]*gama1[1]) +
        dgamas_rhos[2]*(rhos1[i]*tgt1[2] + sigmas1[i][j]*gama1[2]));
			lambdas2[i][j] = 
        (DGama[0]*Tgt2[0]+DGama[1]*Tgt2[1] + DGama[2]*Tgt2[2]) /
        (dgamas_rhos[0]*(rhos2[i]*tgt2[0] + sigmas2[i][j]*gama2[0]) + 
        dgamas_rhos[1]*(rhos2[i]*tgt2[1] + sigmas2[i][j]*gama2[1]) +
        dgamas_rhos[2]*(rhos2[i]*tgt2[2] + sigmas2[i][j]*gama2[2]));
		}
	}

	//% Rotation:
	const T A[3][3] = {
		DGama[0], Tgt1[0], Tgt2[0],
		DGama[1], Tgt1[1], Tgt2[1],
		DGama[2], Tgt1[2], Tgt2[2]};
	T inv_A[3][3]; invm3x3(A, inv_A);

	// Matrix containing Rotations and Translations
	T (&RT)[RT_MAX_LEN][4][3] = *output;
	unsigned &RT_len               = *output_len; RT_len = 0;
	for (unsigned i = 0; i < ts_len; i++) {
		for (unsigned j = 0; j < sigmas1_len[i]; j++, RT_len++) {
			T (&Rots)[4][3] = RT[RT_len]; T (&Transls)[3] = RT[RT_len][3];

			#define B_row(r) \
				rhos1[i]*gama1[(r)] - rhos2[i]*gama2[(r)], \
				lambdas1[i][j]*(rhos1[i]*tgt1[(r)] + sigmas1[i][j]*gama1[(r)]), \
				lambdas2[i][j]*(rhos2[i]*tgt2[(r)] + sigmas2[i][j]*gama2[(r)])

			const T B[3][3] = { B_row(0), B_row(1), B_row(2) };
			multm3x3(B, inv_A, Rots);
      Transls[0] = rhos1[i]*gama1[0] - Rots[0][0] * Gama1[0] - Rots[0][1] * Gama1[1] - Rots[0][2] * Gama1[2];
      Transls[1] = rhos1[i]*gama1[1] - Rots[1][0] * Gama1[0] - Rots[1][1] * Gama1[1] - Rots[1][2] * Gama1[2];
      Transls[2] = rhos1[i]*gama1[2] - Rots[2][0] * Gama1[0] - Rots[2][1] * Gama1[1] - Rots[2][2] * Gama1[2];
		}
	}
}